

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::reportStarted(QFutureInterfaceBase *this)

{
  long lVar1;
  uint uVar2;
  QFutureCallOutEvent *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  int in_stack_ffffffffffffff78;
  State in_stack_ffffffffffffff7c;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff80;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  uVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dd846);
  if ((uVar2 & 0xe) == 0) {
    QFutureInterfaceBasePrivate::setState(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff80 = *(QFutureInterfaceBasePrivate **)&(in_RDI->super_QEvent).t;
    QFutureCallOutEvent::QFutureCallOutEvent
              ((QFutureCallOutEvent *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78);
    QFutureInterfaceBasePrivate::sendCallOut(in_stack_ffffffffffffff90,in_RDI);
    QFutureCallOutEvent::~QFutureCallOutEvent((QFutureCallOutEvent *)in_stack_ffffffffffffff80);
    *(undefined1 *)(*(long *)&(in_RDI->super_QEvent).t + 0xd5) = 1;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::reportStarted()
{
    QMutexLocker locker(&d->m_mutex);
    if (d->state.loadRelaxed() & (Started|Canceled|Finished))
        return;
    d->setState(State(Started | Running));
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Started));
    d->isValid = true;
}